

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall xatlas::internal::segment::Atlas::Atlas(Atlas *this)

{
  (this->m_edgeLengths).m_base.buffer = (uint8_t *)0x0;
  (this->m_edgeLengths).m_base.elementSize = 4;
  (this->m_edgeLengths).m_base.size = 0;
  (this->m_edgeLengths).m_base.capacity = 0;
  (this->m_faceAreas).m_base.buffer = (uint8_t *)0x0;
  (this->m_faceAreas).m_base.elementSize = 4;
  (this->m_faceAreas).m_base.size = 0;
  (this->m_faceAreas).m_base.capacity = 0;
  (this->m_faceNormals).m_base.buffer = (uint8_t *)0x0;
  (this->m_faceNormals).m_base.elementSize = 0xc;
  (this->m_faceNormals).m_base.size = 0;
  (this->m_faceNormals).m_base.capacity = 0;
  (this->m_texcoords).m_base.buffer = (uint8_t *)0x0;
  (this->m_texcoords).m_base.elementSize = 8;
  (this->m_texcoords).m_base.size = 0;
  (this->m_texcoords).m_base.capacity = 0;
  (this->m_faceCharts).m_base.buffer = (uint8_t *)0x0;
  (this->m_faceCharts).m_base.elementSize = 4;
  (this->m_faceCharts).m_base.size = 0;
  (this->m_faceCharts).m_base.capacity = 0;
  (this->m_charts).m_base.buffer = (uint8_t *)0x0;
  (this->m_charts).m_base.elementSize = 8;
  (this->m_charts).m_base.size = 0;
  (this->m_charts).m_base.capacity = 0;
  (this->m_bestTriangles).m_maxSize = 10;
  (this->m_bestTriangles).m_pairs.m_base.buffer = (uint8_t *)0x0;
  (this->m_bestTriangles).m_pairs.m_base.elementSize = 8;
  (this->m_bestTriangles).m_pairs.m_base.size = 0;
  (this->m_bestTriangles).m_pairs.m_base.capacity = 0;
  (this->m_rand).x = 0x75bcd15;
  (this->m_rand).y = 0x159a55a0;
  (this->m_rand).z = 0x1f123bb5;
  (this->m_rand).c = 0x74cbb1;
  ChartOptions::ChartOptions(&this->m_options);
  (this->m_nextPlanarRegionFace).m_base.buffer = (uint8_t *)0x0;
  (this->m_nextPlanarRegionFace).m_base.elementSize = 4;
  (this->m_nextPlanarRegionFace).m_base.size = 0;
  (this->m_nextPlanarRegionFace).m_base.capacity = 0;
  (this->m_facePlanarRegionId).m_base.buffer = (uint8_t *)0x0;
  (this->m_facePlanarRegionId).m_base.elementSize = 4;
  (this->m_facePlanarRegionId).m_base.size = 0;
  (this->m_facePlanarRegionId).m_base.capacity = 0;
  (this->m_tempPoints).m_base.buffer = (uint8_t *)0x0;
  (this->m_tempPoints).m_base.elementSize = 0xc;
  (this->m_tempPoints).m_base.size = 0;
  (this->m_tempPoints).m_base.capacity = 0;
  UniformGrid2::UniformGrid2(&this->m_boundaryGrid);
  (this->m_sharedBoundaryLengths).m_base.buffer = (uint8_t *)0x0;
  (this->m_sharedBoundaryLengths).m_base.elementSize = 4;
  (this->m_sharedBoundaryLengths).m_base.size = 0;
  (this->m_sharedBoundaryLengths).m_base.capacity = 0;
  (this->m_sharedBoundaryLengthsNoSeams).m_base.buffer = (uint8_t *)0x0;
  (this->m_sharedBoundaryLengthsNoSeams).m_base.elementSize = 4;
  (this->m_sharedBoundaryLengthsNoSeams).m_base.size = 0;
  (this->m_sharedBoundaryLengthsNoSeams).m_base.capacity = 0;
  (this->m_sharedBoundaryEdgeCountNoSeams).m_base.buffer = (uint8_t *)0x0;
  (this->m_sharedBoundaryEdgeCountNoSeams).m_base.elementSize = 4;
  (this->m_sharedBoundaryEdgeCountNoSeams).m_base.size = 0;
  (this->m_sharedBoundaryEdgeCountNoSeams).m_base.capacity = 0;
  return;
}

Assistant:

Atlas() : m_edgeLengths(MemTag::SegmentAtlasMeshData), m_faceAreas(MemTag::SegmentAtlasMeshData), m_faceNormals(MemTag::SegmentAtlasMeshData), m_texcoords(MemTag::SegmentAtlasMeshData), m_bestTriangles(10), m_nextPlanarRegionFace(MemTag::SegmentAtlasPlanarRegions), m_facePlanarRegionId(MemTag::SegmentAtlasPlanarRegions) {}